

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

int __thiscall teebuf::overflow(teebuf *this,int c)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int r2;
  int r1;
  int c_local;
  teebuf *this_local;
  
  iVar1 = std::streambuf::sputc((char)this->sb1_);
  iVar2 = std::streambuf::sputc((char)this->sb2_);
  if ((iVar1 == -1) || (local_2c = c, iVar2 == -1)) {
    local_2c = -1;
  }
  return local_2c;
}

Assistant:

virtual int overflow( int c )
    {
        int r1 = sb1_->sputc( c );
        int r2 = sb2_->sputc( c );

        return r1 == EOF || r2 == EOF? EOF : c;
    }